

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O0

UBool __thiscall
icu_63::FractionalPartSubstitution::doParse
          (FractionalPartSubstitution *this,UnicodeString *text,ParsePosition *parsePosition,
          double baseValue,double param_4,UBool lenientParse,uint32_t nonNumericalExecutedRuleMask,
          Formattable *resVal)

{
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  int32_t iVar4;
  NFRuleSet *this_00;
  bool bVar5;
  double dVar6;
  double d;
  UErrorCode local_18c;
  undefined1 local_188 [4];
  UErrorCode status;
  Formattable temp;
  NumberFormat *fmt;
  undefined1 local_108 [4];
  int32_t totalDigits;
  DecimalQuantity dl;
  int32_t digit;
  double result;
  undefined1 local_98 [8];
  ParsePosition workPos;
  UnicodeString workText;
  Formattable *resVal_local;
  uint32_t nonNumericalExecutedRuleMask_local;
  UBool lenientParse_local;
  double param_4_local;
  double baseValue_local;
  ParsePosition *parsePosition_local;
  UnicodeString *text_local;
  FractionalPartSubstitution *this_local;
  
  if (this->byDigits == '\0') {
    this_local._7_1_ =
         NFSubstitution::doParse
                   (&this->super_NFSubstitution,text,parsePosition,baseValue,0.0,lenientParse,
                    nonNumericalExecutedRuleMask,resVal);
  }
  else {
    UnicodeString::UnicodeString((UnicodeString *)&workPos.index,text);
    ParsePosition::ParsePosition((ParsePosition *)local_98,1);
    icu_63::number::impl::DecimalQuantity::DecimalQuantity((DecimalQuantity *)local_108);
    fmt._4_4_ = 0;
    temp.fBogus.fUnion._48_8_ = 0;
    while( true ) {
      iVar3 = UnicodeString::length((UnicodeString *)&workPos.index);
      bVar5 = false;
      if (0 < iVar3) {
        iVar3 = ParsePosition::getIndex((ParsePosition *)local_98);
        bVar5 = iVar3 != 0;
      }
      if (!bVar5) break;
      ParsePosition::setIndex((ParsePosition *)local_98,0);
      Formattable::Formattable((Formattable *)local_188);
      this_00 = NFSubstitution::getRuleSet(&this->super_NFSubstitution);
      NFRuleSet::parse(this_00,(UnicodeString *)&workPos.index,(ParsePosition *)local_98,10.0,
                       nonNumericalExecutedRuleMask,(Formattable *)local_188);
      local_18c = U_ZERO_ERROR;
      dl._76_4_ = Formattable::getLong((Formattable *)local_188,&local_18c);
      if ((lenientParse != '\0') &&
         (iVar3 = ParsePosition::getIndex((ParsePosition *)local_98), iVar3 == 0)) {
        if (temp.fBogus.fUnion._48_8_ == 0) {
          local_18c = U_ZERO_ERROR;
          temp.fBogus.fUnion._48_8_ = NumberFormat::createInstance(&local_18c);
          UVar1 = ::U_FAILURE(local_18c);
          if (UVar1 != '\0') {
            if (temp.fBogus.fUnion._48_8_ != 0) {
              (**(code **)(*(long *)temp.fBogus.fUnion._48_8_ + 8))();
            }
            temp.fBogus.fUnion._48_8_ = 0;
          }
        }
        if (temp.fBogus.fUnion._48_8_ != 0) {
          (**(code **)(*(long *)temp.fBogus.fUnion._48_8_ + 0xa0))
                    (temp.fBogus.fUnion._48_8_,&workPos.index,local_188,local_98);
          dl._76_4_ = Formattable::getLong((Formattable *)local_188,&local_18c);
        }
      }
      iVar3 = ParsePosition::getIndex((ParsePosition *)local_98);
      if (iVar3 != 0) {
        icu_63::number::impl::DecimalQuantity::appendDigit
                  ((DecimalQuantity *)local_108,dl._76_1_,0,true);
        fmt._4_4_ = fmt._4_4_ + 1;
        iVar3 = ParsePosition::getIndex(parsePosition);
        iVar4 = ParsePosition::getIndex((ParsePosition *)local_98);
        ParsePosition::setIndex(parsePosition,iVar3 + iVar4);
        iVar3 = ParsePosition::getIndex((ParsePosition *)local_98);
        UnicodeString::removeBetween((UnicodeString *)&workPos.index,0,iVar3);
        while( true ) {
          iVar3 = UnicodeString::length((UnicodeString *)&workPos.index);
          bVar5 = false;
          if (0 < iVar3) {
            cVar2 = UnicodeString::charAt((UnicodeString *)&workPos.index,0);
            bVar5 = cVar2 == L' ';
          }
          if (!bVar5) break;
          UnicodeString::removeBetween((UnicodeString *)&workPos.index,0,1);
          iVar3 = ParsePosition::getIndex(parsePosition);
          ParsePosition::setIndex(parsePosition,iVar3 + 1);
        }
      }
      Formattable::~Formattable((Formattable *)local_188);
    }
    if (temp.fBogus.fUnion._48_8_ != 0) {
      (**(code **)(*(long *)temp.fBogus.fUnion._48_8_ + 8))();
    }
    icu_63::number::impl::DecimalQuantity::adjustMagnitude((DecimalQuantity *)local_108,-fmt._4_4_);
    dVar6 = icu_63::number::impl::DecimalQuantity::toDouble((DecimalQuantity *)local_108);
    (*(this->super_NFSubstitution).super_UObject._vptr_UObject[0xb])(dVar6,baseValue);
    Formattable::setDouble(resVal,d);
    this_local._7_1_ = '\x01';
    icu_63::number::impl::DecimalQuantity::~DecimalQuantity((DecimalQuantity *)local_108);
    ParsePosition::~ParsePosition((ParsePosition *)local_98);
    UnicodeString::~UnicodeString((UnicodeString *)&workPos.index);
  }
  return this_local._7_1_;
}

Assistant:

UBool
FractionalPartSubstitution::doParse(const UnicodeString& text,
                ParsePosition& parsePosition,
                double baseValue,
                double /*upperBound*/,
                UBool lenientParse,
                uint32_t nonNumericalExecutedRuleMask,
                Formattable& resVal) const
{
    // if we're not in byDigits mode, we can just use the inherited
    // doParse()
    if (!byDigits) {
        return NFSubstitution::doParse(text, parsePosition, baseValue, 0, lenientParse, nonNumericalExecutedRuleMask, resVal);

        // if we ARE in byDigits mode, parse the text one digit at a time
        // using this substitution's owning rule set (we do this by setting
        // upperBound to 10 when calling doParse() ) until we reach
        // nonmatching text
    } else {
        UnicodeString workText(text);
        ParsePosition workPos(1);
        double result = 0;
        int32_t digit;
//          double p10 = 0.1;

        DecimalQuantity dl;
        int32_t totalDigits = 0;
        NumberFormat* fmt = NULL;
        while (workText.length() > 0 && workPos.getIndex() != 0) {
            workPos.setIndex(0);
            Formattable temp;
            getRuleSet()->parse(workText, workPos, 10, nonNumericalExecutedRuleMask, temp);
            UErrorCode status = U_ZERO_ERROR;
            digit = temp.getLong(status);
//            digit = temp.getType() == Formattable::kLong ?
//               temp.getLong() :
//            (int32_t)temp.getDouble();

            if (lenientParse && workPos.getIndex() == 0) {
                if (!fmt) {
                    status = U_ZERO_ERROR;
                    fmt = NumberFormat::createInstance(status);
                    if (U_FAILURE(status)) {
                        delete fmt;
                        fmt = NULL;
                    }
                }
                if (fmt) {
                    fmt->parse(workText, temp, workPos);
                    digit = temp.getLong(status);
                }
            }

            if (workPos.getIndex() != 0) {
                dl.appendDigit(static_cast<int8_t>(digit), 0, true);
                totalDigits++;
//                  result += digit * p10;
//                  p10 /= 10;
                parsePosition.setIndex(parsePosition.getIndex() + workPos.getIndex());
                workText.removeBetween(0, workPos.getIndex());
                while (workText.length() > 0 && workText.charAt(0) == gSpace) {
                    workText.removeBetween(0, 1);
                    parsePosition.setIndex(parsePosition.getIndex() + 1);
                }
            }
        }
        delete fmt;

        dl.adjustMagnitude(-totalDigits);
        result = dl.toDouble();
        result = composeRuleValue(result, baseValue);
        resVal.setDouble(result);
        return TRUE;
    }
}